

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O0

int lib::table::Pack(State *state)

{
  int iVar1;
  Table *pTVar2;
  State *in_RDI;
  int i;
  int params;
  Table *table;
  StackAPI api;
  Table *in_stack_ffffffffffffffc8;
  StackAPI *in_stack_ffffffffffffffd0;
  int iVar3;
  Table *index;
  State *in_stack_ffffffffffffffe8;
  
  luna::StackAPI::StackAPI((StackAPI *)&stack0xffffffffffffffe8,in_RDI);
  pTVar2 = luna::State::NewTable((State *)0x167a62);
  iVar1 = luna::StackAPI::GetStackSize(in_stack_ffffffffffffffd0);
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffd0 = (StackAPI *)(long)(iVar3 + 1);
    index = pTVar2;
    luna::StackAPI::GetValue((StackAPI *)in_stack_ffffffffffffffe8,(int)((ulong)pTVar2 >> 0x20));
    luna::Table::SetArrayValue
              ((Table *)in_stack_ffffffffffffffe8,(size_t)index,(Value *)CONCAT44(iVar1,iVar3));
    in_stack_ffffffffffffffc8 = pTVar2;
    pTVar2 = index;
  }
  luna::StackAPI::PushTable(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return 1;
}

Assistant:

int Pack(luna::State *state)
    {
        luna::StackAPI api(state);

        auto table = state->NewTable();
        auto params = api.GetStackSize();
        for (int i = 0; i < params; ++i)
            table->SetArrayValue(i + 1, *api.GetValue(i));

        api.PushTable(table);
        return 1;
    }